

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_QUOTE_INFO_Unmarshal(TPMS_QUOTE_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPML_PCR_SELECTION_Unmarshal(&target->pcrSelect,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPM2B_DIGEST_Unmarshal(&target->pcrDigest,buffer,size);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_QUOTE_INFO_Unmarshal(TPMS_QUOTE_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPML_PCR_SELECTION_Unmarshal((TPML_PCR_SELECTION *)&(target->pcrSelect), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->pcrDigest), buffer, size);
    return result;
}